

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

int32_t createTagStringWithAlternates
                  (char *lang,int32_t langLength,char *script,int32_t scriptLength,char *region,
                  int32_t regionLength,char *trailing,int32_t trailingLength,char *alternateTags,
                  char *tag,int32_t tagCapacity,UErrorCode *err)

{
  UBool UVar1;
  int32_t tagLength_00;
  int iVar2;
  int iVar3;
  int local_128;
  int32_t local_124;
  int32_t toCopy_1;
  int32_t toCopy;
  int32_t alternateRegionLength;
  char alternateRegion [4];
  int32_t alternateScriptLength;
  char cStack_104;
  char cStack_103;
  char alternateScript [6];
  int32_t alternateLangLength;
  char alternateLang [12];
  UBool regionAppended;
  int32_t capacityRemaining;
  int32_t tagLength;
  char tagBuffer [157];
  int32_t regionLength_local;
  char *region_local;
  int32_t scriptLength_local;
  char *script_local;
  int32_t langLength_local;
  char *lang_local;
  
  UVar1 = U_FAILURE(*err);
  if (((((UVar1 == '\0') && (tag != (char *)0x0)) && (0 < tagCapacity)) &&
      ((langLength < 0xc && (scriptLength < 6)))) && (regionLength < 4)) {
    stack0xffffffffffffff14 = 0;
    alternateLang._5_4_ = tagCapacity;
    alternateLang[4] = '\0';
    if (langLength < 1) {
      if (alternateTags == (char *)0x0) {
        appendTag("und",3,(char *)&capacityRemaining,(int32_t *)(alternateLang + 9));
      }
      else {
        cStack_104 = '\f';
        cStack_103 = '\0';
        alternateScript[0] = '\0';
        alternateScript[1] = '\0';
        _cStack_104 = uloc_getLanguage_63(alternateTags,alternateScript + 5,0xc,err);
        UVar1 = U_FAILURE(*err);
        if ((UVar1 != '\0') || (0xb < _cStack_104)) goto LAB_00329e09;
        if (_cStack_104 == 0) {
          appendTag("und",3,(char *)&capacityRemaining,(int32_t *)(alternateLang + 9));
        }
        else {
          appendTag(alternateScript + 5,_cStack_104,(char *)&capacityRemaining,
                    (int32_t *)(alternateLang + 9));
        }
      }
    }
    else {
      appendTag(lang,langLength,(char *)&capacityRemaining,(int32_t *)(alternateLang + 9));
    }
    if (scriptLength < 1) {
      if (alternateTags != (char *)0x0) {
        alternateRegionLength = uloc_getScript_63(alternateTags,alternateRegion + 2,6,err);
        UVar1 = U_FAILURE(*err);
        if ((UVar1 != '\0') || (5 < alternateRegionLength)) goto LAB_00329e09;
        if (0 < alternateRegionLength) {
          appendTag(alternateRegion + 2,alternateRegionLength,(char *)&capacityRemaining,
                    (int32_t *)(alternateLang + 9));
        }
      }
    }
    else {
      appendTag(script,scriptLength,(char *)&capacityRemaining,(int32_t *)(alternateLang + 9));
    }
    if (regionLength < 1) {
      if (alternateTags != (char *)0x0) {
        tagLength_00 = uloc_getCountry_63(alternateTags,(char *)&toCopy,4,err);
        UVar1 = U_FAILURE(*err);
        if ((UVar1 != '\0') || (3 < tagLength_00)) goto LAB_00329e09;
        if (0 < tagLength_00) {
          appendTag((char *)&toCopy,tagLength_00,(char *)&capacityRemaining,
                    (int32_t *)(alternateLang + 9));
          alternateLang[4] = '\x01';
        }
      }
    }
    else {
      appendTag(region,regionLength,(char *)&capacityRemaining,(int32_t *)(alternateLang + 9));
      alternateLang[4] = '\x01';
    }
    if (stack0xffffffffffffff14 < tagCapacity) {
      local_124 = stack0xffffffffffffff14;
    }
    else {
      local_124 = tagCapacity;
    }
    memcpy(tag,&capacityRemaining,(long)local_124);
    iVar2 = alternateLang._5_4_ - local_124;
    alternateLang._5_4_ = iVar2;
    if (0 < trailingLength) {
      iVar3 = stack0xffffffffffffff14;
      if ((*trailing != '@') && (0 < iVar2)) {
        iVar3 = stack0xffffffffffffff14 + 1;
        tag[stack0xffffffffffffff14] = '_';
        alternateLang._5_4_ = iVar2 + -1;
        if ((0 < (int)alternateLang._5_4_) && (alternateLang[4] == '\0')) {
          tag[iVar3] = '_';
          alternateLang._5_4_ = iVar2 + -2;
          iVar3 = stack0xffffffffffffff14 + 2;
        }
      }
      stack0xffffffffffffff14 = iVar3;
      if (0 < (int)alternateLang._5_4_) {
        if (trailingLength < (int)alternateLang._5_4_) {
          local_128 = trailingLength;
        }
        else {
          local_128._0_1_ = alternateLang[5];
          local_128._1_1_ = alternateLang[6];
          local_128._2_1_ = alternateLang[7];
          local_128._3_1_ = alternateLang[8];
        }
        memmove(tag + stack0xffffffffffffff14,trailing,(long)local_128);
      }
    }
    register0x00000000 = trailingLength + stack0xffffffffffffff14;
    lang_local._4_4_ = u_terminateChars_63(tag,tagCapacity,register0x00000000,err);
  }
  else {
LAB_00329e09:
    if ((*err == U_BUFFER_OVERFLOW_ERROR) || (UVar1 = U_SUCCESS(*err), UVar1 != '\0')) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
    lang_local._4_4_ = -1;
  }
  return lang_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
createTagStringWithAlternates(
    const char* lang,
    int32_t langLength,
    const char* script,
    int32_t scriptLength,
    const char* region,
    int32_t regionLength,
    const char* trailing,
    int32_t trailingLength,
    const char* alternateTags,
    char* tag,
    int32_t tagCapacity,
    UErrorCode* err) {

    if (U_FAILURE(*err)) {
        goto error;
    }
    else if (tag == NULL ||
             tagCapacity <= 0 ||
             langLength >= ULOC_LANG_CAPACITY ||
             scriptLength >= ULOC_SCRIPT_CAPACITY ||
             regionLength >= ULOC_COUNTRY_CAPACITY) {
        goto error;
    }
    else {
        /**
         * ULOC_FULLNAME_CAPACITY will provide enough capacity
         * that we can build a string that contains the language,
         * script and region code without worrying about overrunning
         * the user-supplied buffer.
         **/
        char tagBuffer[ULOC_FULLNAME_CAPACITY];
        int32_t tagLength = 0;
        int32_t capacityRemaining = tagCapacity;
        UBool regionAppended = FALSE;

        if (langLength > 0) {
            appendTag(
                lang,
                langLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags == NULL) {
            /*
             * Append the value for an unknown language, if
             * we found no language.
             */
            appendTag(
                unknownLanguage,
                (int32_t)uprv_strlen(unknownLanguage),
                tagBuffer,
                &tagLength);
        }
        else {
            /*
             * Parse the alternateTags string for the language.
             */
            char alternateLang[ULOC_LANG_CAPACITY];
            int32_t alternateLangLength = sizeof(alternateLang);

            alternateLangLength =
                uloc_getLanguage(
                    alternateTags,
                    alternateLang,
                    alternateLangLength,
                    err);
            if(U_FAILURE(*err) ||
                alternateLangLength >= ULOC_LANG_CAPACITY) {
                goto error;
            }
            else if (alternateLangLength == 0) {
                /*
                 * Append the value for an unknown language, if
                 * we found no language.
                 */
                appendTag(
                    unknownLanguage,
                    (int32_t)uprv_strlen(unknownLanguage),
                    tagBuffer,
                    &tagLength);
            }
            else {
                appendTag(
                    alternateLang,
                    alternateLangLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (scriptLength > 0) {
            appendTag(
                script,
                scriptLength,
                tagBuffer,
                &tagLength);
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the script.
             */
            char alternateScript[ULOC_SCRIPT_CAPACITY];

            const int32_t alternateScriptLength =
                uloc_getScript(
                    alternateTags,
                    alternateScript,
                    sizeof(alternateScript),
                    err);

            if (U_FAILURE(*err) ||
                alternateScriptLength >= ULOC_SCRIPT_CAPACITY) {
                goto error;
            }
            else if (alternateScriptLength > 0) {
                appendTag(
                    alternateScript,
                    alternateScriptLength,
                    tagBuffer,
                    &tagLength);
            }
        }

        if (regionLength > 0) {
            appendTag(
                region,
                regionLength,
                tagBuffer,
                &tagLength);

            regionAppended = TRUE;
        }
        else if (alternateTags != NULL) {
            /*
             * Parse the alternateTags string for the region.
             */
            char alternateRegion[ULOC_COUNTRY_CAPACITY];

            const int32_t alternateRegionLength =
                uloc_getCountry(
                    alternateTags,
                    alternateRegion,
                    sizeof(alternateRegion),
                    err);
            if (U_FAILURE(*err) ||
                alternateRegionLength >= ULOC_COUNTRY_CAPACITY) {
                goto error;
            }
            else if (alternateRegionLength > 0) {
                appendTag(
                    alternateRegion,
                    alternateRegionLength,
                    tagBuffer,
                    &tagLength);

                regionAppended = TRUE;
            }
        }

        {
            const int32_t toCopy =
                tagLength >= tagCapacity ? tagCapacity : tagLength;

            /**
             * Copy the partial tag from our internal buffer to the supplied
             * target.
             **/
            uprv_memcpy(
                tag,
                tagBuffer,
                toCopy);

            capacityRemaining -= toCopy;
        }

        if (trailingLength > 0) {
            if (*trailing != '@' && capacityRemaining > 0) {
                tag[tagLength++] = '_';
                --capacityRemaining;
                if (capacityRemaining > 0 && !regionAppended) {
                    /* extra separator is required */
                    tag[tagLength++] = '_';
                    --capacityRemaining;
                }
            }

            if (capacityRemaining > 0) {
                /*
                 * Copy the trailing data into the supplied buffer.  Use uprv_memmove, since we
                 * don't know if the user-supplied buffers overlap.
                 */
                const int32_t toCopy =
                    trailingLength >= capacityRemaining ? capacityRemaining : trailingLength;

                uprv_memmove(
                    &tag[tagLength],
                    trailing,
                    toCopy);
            }
        }

        tagLength += trailingLength;

        return u_terminateChars(
                    tag,
                    tagCapacity,
                    tagLength,
                    err);
    }

error:

    /**
     * An overflow indicates the locale ID passed in
     * is ill-formed.  If we got here, and there was
     * no previous error, it's an implicit overflow.
     **/
    if (*err ==  U_BUFFER_OVERFLOW_ERROR ||
        U_SUCCESS(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    return -1;
}